

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SscWriterGeneric.cpp
# Opt level: O1

void __thiscall adios2::core::engine::ssc::SscWriterGeneric::SyncReadPattern(SscWriterGeneric *this)

{
  BlockVecVec *output;
  RankPosMap *allOverlapRanks;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint __val;
  uint uVar4;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  __buckets_ptr pp_Var8;
  SscWriterGeneric *this_00;
  int iVar9;
  uint __len;
  uint uVar10;
  string __str;
  undefined1 local_b0 [56];
  Buffer globalBuffer;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_b0._0_8_ = local_b0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"Engine","");
  __str._M_dataplus._M_p = (pointer)&__str.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&__str,"SscWriter","");
  globalBuffer.m_Capacity = (size_t)&globalBuffer.m_Buffer;
  std::__cxx11::string::_M_construct<char_const*>((string *)&globalBuffer,"SyncReadPattern","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"");
  iVar1 = (this->super_SscWriterBase).m_WriterRank;
  iVar2 = (this->super_SscWriterBase).m_Verbosity;
  iVar9 = 0;
  if (9 < iVar2) {
    iVar9 = iVar1;
  }
  adios2::helper::Log((string *)local_b0,(string *)&__str,(string *)&globalBuffer,(string *)local_50
                      ,iVar9,iVar1,5,iVar2,INFO);
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((uint8_t **)globalBuffer.m_Capacity != &globalBuffer.m_Buffer) {
    operator_delete((void *)globalBuffer.m_Capacity);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)__str._M_dataplus._M_p != &__str.field_2) {
    operator_delete(__str._M_dataplus._M_p);
  }
  if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
    operator_delete((void *)local_b0._0_8_);
  }
  globalBuffer.m_Buffer = (uint8_t *)malloc(1);
  globalBuffer.m_Capacity = 1;
  globalBuffer.m_Size = 0;
  BroadcastMetadata(&globalBuffer,(this->super_SscWriterBase).m_ReaderMasterStreamRank,
                    (this->super_SscWriterBase).m_StreamComm);
  this->m_ReaderSelectionsLocked = globalBuffer.m_Buffer[1] != '\0';
  output = &this->m_GlobalReadPattern;
  Deserialize(&globalBuffer,output,(this->super_SscWriterBase).m_IO,false,false,false,
              &this->m_StructDefinitions);
  CalculateOverlap((RankPosMap *)local_b0,output,
                   (this->m_GlobalWritePattern).
                   super__Vector_base<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>,_std::allocator<std::vector<adios2::core::engine::ssc::BlockInfo,_std::allocator<adios2::core::engine::ssc::BlockInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start +
                   (this->super_SscWriterBase).m_StreamRank);
  allOverlapRanks = &this->m_AllSendingReaderRanks;
  std::
  _Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_M_move_assign(&allOverlapRanks->_M_h,local_b0);
  this_00 = (SscWriterGeneric *)local_b0;
  std::
  _Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>,_std::allocator<std::pair<const_int,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)this_00);
  CalculatePosition(this_00,&this->m_GlobalWritePattern,output,
                    (this->super_SscWriterBase).m_WriterRank,allOverlapRanks);
  if (9 < (this->super_SscWriterBase).m_Verbosity) {
    if (0 < (this->super_SscWriterBase).m_WriterSize) {
      uVar10 = 0;
      do {
        MPI_Barrier((this->super_SscWriterBase).m_WriterComm);
        uVar3 = (this->super_SscWriterBase).m_WriterRank;
        if (uVar10 == uVar3) {
          __val = -uVar3;
          if (0 < (int)uVar3) {
            __val = uVar3;
          }
          __len = 1;
          if (9 < __val) {
            uVar7 = (ulong)__val;
            uVar4 = 4;
            do {
              __len = uVar4;
              uVar5 = (uint)uVar7;
              if (uVar5 < 100) {
                __len = __len - 2;
                goto LAB_0013ffbd;
              }
              if (uVar5 < 1000) {
                __len = __len - 1;
                goto LAB_0013ffbd;
              }
              if (uVar5 < 10000) goto LAB_0013ffbd;
              uVar7 = uVar7 / 10000;
              uVar4 = __len + 4;
            } while (99999 < uVar5);
            __len = __len + 1;
          }
LAB_0013ffbd:
          __str._M_dataplus._M_p = (pointer)&__str.field_2;
          std::__cxx11::string::_M_construct((ulong)&__str,(char)__len - (char)((int)uVar3 >> 0x1f))
          ;
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (__str._M_dataplus._M_p + (uVar3 >> 0x1f),__len,__val);
          plVar6 = (long *)std::__cxx11::string::replace((ulong)&__str,0,(char *)0x0,0x155c22);
          pp_Var8 = (__buckets_ptr)(plVar6 + 2);
          if ((__buckets_ptr)*plVar6 == pp_Var8) {
            local_b0._16_8_ = *pp_Var8;
            local_b0._24_8_ = plVar6[3];
            local_b0._0_8_ = local_b0 + 0x10;
          }
          else {
            local_b0._16_8_ = *pp_Var8;
            local_b0._0_8_ = (__buckets_ptr)*plVar6;
          }
          local_b0._8_8_ = plVar6[1];
          *plVar6 = (long)pp_Var8;
          plVar6[1] = 0;
          *(undefined1 *)(plVar6 + 2) = 0;
          PrintRankPosMap(allOverlapRanks,(string *)local_b0);
          if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
            operator_delete((void *)local_b0._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)__str._M_dataplus._M_p != &__str.field_2) {
            operator_delete(__str._M_dataplus._M_p);
          }
        }
        uVar10 = uVar10 + 1;
      } while ((int)uVar10 < (this->super_SscWriterBase).m_WriterSize);
    }
    MPI_Barrier((this->super_SscWriterBase).m_WriterComm);
  }
  if (globalBuffer.m_Buffer != (uint8_t *)0x0) {
    free(globalBuffer.m_Buffer);
  }
  return;
}

Assistant:

void SscWriterGeneric::SyncReadPattern()
{

    helper::Log("Engine", "SscWriter", "SyncReadPattern", "", m_Verbosity >= 10 ? m_WriterRank : 0,
                m_WriterRank, 5, m_Verbosity, helper::LogMode::INFO);

    ssc::Buffer globalBuffer;

    ssc::BroadcastMetadata(globalBuffer, m_ReaderMasterStreamRank, m_StreamComm);

    m_ReaderSelectionsLocked = globalBuffer[1];

    ssc::Deserialize(globalBuffer, m_GlobalReadPattern, m_IO, false, false, false,
                     m_StructDefinitions);
    m_AllSendingReaderRanks =
        ssc::CalculateOverlap(m_GlobalReadPattern, m_GlobalWritePattern[m_StreamRank]);
    CalculatePosition(m_GlobalWritePattern, m_GlobalReadPattern, m_WriterRank,
                      m_AllSendingReaderRanks);

    if (m_Verbosity >= 10)
    {
        for (int i = 0; i < m_WriterSize; ++i)
        {
            MPI_Barrier(m_WriterComm);
            if (i == m_WriterRank)
            {
                ssc::PrintRankPosMap(m_AllSendingReaderRanks,
                                     "Rank Pos Map for Writer " + std::to_string(m_WriterRank));
            }
        }
        MPI_Barrier(m_WriterComm);
    }
}